

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageSyncCS::Run(AdvancedUsageSyncCS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  GLuint GVar3;
  void *pvVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *format;
  int data [4];
  string local_58;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "\nlayout(local_size_x = 1) in;\nlayout(std430, binding = 0) coherent buffer Buffer0 {\n  int g_data0, g_inc0;\n  int g_data1, g_inc1;\n};\nlayout(std430, binding = 1) buffer Buffer12 {\n  int inc, data;\n} g_buffer12[2];\nlayout(binding = 3, std430) coherent buffer Buffer3 {\n  int data;\n} g_buffer3;\nlayout(std430, binding = 4) coherent buffer Buffer4 {\n  int data0, inc0;\n  int data1, inc1;\n} g_buffer4;\nlayout(std430, binding = 5) buffer Buffer56 {\n  int inc, data;\n} g_buffer56[2];\n\nvoid Modify1(int path) {\n  if (path == 0) {\n    atomicAdd(g_data0, g_inc0);\n    atomicAdd(g_data1, g_inc0);\n  } else if (path == 1) {\n    atomicAdd(g_data0, - g_inc0);\n    atomicAdd(g_data1, - g_inc0);\n  } else if (path == 2) {\n    atomicAdd(g_data0, g_inc1);\n    atomicAdd(g_data1, g_inc1);\n  }\n  if (path == 0) {\n    g_buffer12[0].data += g_buffer12[1].inc;\n  } else if (path == 1) {\n    g_buffer12[1].data += g_buffer12[0].inc;\n  }\n}\n\nvoid Modify2(int path) {\n  if (path == 0) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc0);\n  } else if (path == 1) {\n    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);\n    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);\n  } else if (path == 2) {\n    atomicAdd(g_buffer4.data0, g_buffer4.inc1);\n    atomicAdd(g_buffer4.data1, g_buffer4.inc1);\n  }\n  if (path == 0) {\n    g_buffer56[0].data += g_buffer56[1].inc;\n  } else if (path == 1) {\n    g_buffer56[1].data += g_buffer56[0].inc;\n  }\n}\n\nvoid main() {\n  Modify1(int(gl_WorkGroupID.z));\n  atomicAdd(g_buffer3.data, 1);\n  Modify2(int(gl_WorkGroupID.z));\n}"
             ,"");
  GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_58);
  this->m_program = GVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  lVar6 = -1;
  if (bVar2) {
    glu::CallLogWrapper::glGenBuffers(this_00,7,this->m_storage_buffer);
    local_58._M_dataplus._M_p = (pointer)0x100000000;
    local_58._M_string_length = 0x200000000;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_58,0x88ea);
    local_58._M_dataplus._M_p = (pointer)0x100000003;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_58,0x88ea);
    local_58._M_dataplus._M_p = (pointer)0x400000002;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_58,0x88ea);
    local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer[3]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&local_58,0x88ea);
    local_58._M_dataplus._M_p = (pointer)0x100000000;
    local_58._M_string_length = 0x200000000;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[4]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_58,0x88ea);
    local_58._M_dataplus._M_p = (pointer)0x100000003;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,5,this->m_storage_buffer[5]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_58,0x88ea);
    local_58._M_dataplus._M_p = (pointer)0x400000002;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,6,this->m_storage_buffer[6]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,&local_58,0x88ea);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,3);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,3);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
    pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
    if (pvVar4 != (void *)0x0) {
      piVar8 = &DAT_01a92390;
      lVar7 = 0;
      do {
        if (*(int *)((long)pvVar4 + lVar7 * 4) != *piVar8) {
          format = "[Buffer0] Data at index %d is %d should be %d.\n";
          goto LAB_00979393;
        }
        lVar7 = lVar7 + 1;
        piVar8 = piVar8 + 1;
      } while (lVar7 != 4);
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
      pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,1);
      if (pvVar4 != (void *)0x0) {
        piVar8 = &DAT_01a949d8;
        lVar7 = 0;
        do {
          if (*(int *)((long)pvVar4 + lVar7 * 4) != *piVar8) {
            format = "[Buffer1] Data at index %d is %d should be %d.\n";
            goto LAB_00979393;
          }
          lVar7 = lVar7 + 1;
          piVar8 = piVar8 + 1;
        } while (lVar7 == 1);
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
        pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,1);
        if (pvVar4 != (void *)0x0) {
          piVar8 = &DAT_01a949e0;
          lVar7 = 0;
          do {
            if (*(int *)((long)pvVar4 + lVar7 * 4) != *piVar8) {
              format = "[Buffer2] Data at index %d is %d should be %d.\n";
              goto LAB_00979393;
            }
            lVar7 = lVar7 + 1;
            piVar8 = piVar8 + 1;
          } while (lVar7 == 1);
          glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
          glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
          puVar5 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,4,1);
          if (puVar5 != (uint *)0x0) {
            bVar2 = true;
            do {
              bVar1 = bVar2;
              if (!bVar1) goto LAB_00979245;
              bVar2 = false;
            } while (*puVar5 == 6);
            anon_unknown_0::Output
                      ("[Buffer3] Data at index %d is %d should be %d.\n",0,(ulong)*puVar5,6);
            if (!bVar1) {
LAB_00979245:
              glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
              glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
              pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
              if (pvVar4 != (void *)0x0) {
                piVar8 = &DAT_01a92390;
                lVar7 = 0;
                do {
                  if (*(int *)((long)pvVar4 + lVar7 * 4) != *piVar8) {
                    format = "[Buffer4] Data at index %d is %d should be %d.\n";
                    goto LAB_00979393;
                  }
                  lVar7 = lVar7 + 1;
                  piVar8 = piVar8 + 1;
                } while (lVar7 != 4);
                glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
                glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[5]);
                pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,1);
                if (pvVar4 != (void *)0x0) {
                  piVar8 = &DAT_01a949d8;
                  lVar7 = 0;
                  do {
                    if (*(int *)((long)pvVar4 + lVar7 * 4) != *piVar8) {
                      format = "[Buffer5] Data at index %d is %d should be %d.\n";
                      goto LAB_00979393;
                    }
                    lVar7 = lVar7 + 1;
                    piVar8 = piVar8 + 1;
                  } while (lVar7 == 1);
                  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
                  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[6]);
                  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,8,1);
                  if (pvVar4 != (void *)0x0) {
                    piVar8 = &DAT_01a949e0;
                    lVar6 = 0;
                    do {
                      if (*(int *)((long)pvVar4 + lVar6 * 4) != *piVar8) {
                        format = "[Buffer6] Data at index %d is %d should be %d.\n";
LAB_00979393:
                        anon_unknown_0::Output(format);
                        return -1;
                      }
                      lVar6 = lVar6 + 1;
                      piVar8 = piVar8 + 1;
                    } while (lVar6 == 1);
                    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
                    lVar6 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430, binding = 0) coherent buffer Buffer0 {" NL
			   "  int g_data0, g_inc0;" NL "  int g_data1, g_inc1;" NL "};" NL
			   "layout(std430, binding = 1) buffer Buffer12 {" NL "  int inc, data;" NL "} g_buffer12[2];" NL
			   "layout(binding = 3, std430) coherent buffer Buffer3 {" NL "  int data;" NL "} g_buffer3;" NL
			   "layout(std430, binding = 4) coherent buffer Buffer4 {" NL "  int data0, inc0;" NL
			   "  int data1, inc1;" NL "} g_buffer4;" NL "layout(std430, binding = 5) buffer Buffer56 {" NL
			   "  int inc, data;" NL "} g_buffer56[2];" NL NL "void Modify1(int path) {" NL "  if (path == 0) {" NL
			   "    atomicAdd(g_data0, g_inc0);" NL "    atomicAdd(g_data1, g_inc0);" NL "  } else if (path == 1) {" NL
			   "    atomicAdd(g_data0, - g_inc0);" NL "    atomicAdd(g_data1, - g_inc0);" NL
			   "  } else if (path == 2) {" NL "    atomicAdd(g_data0, g_inc1);" NL "    atomicAdd(g_data1, g_inc1);" NL
			   "  }" NL "  if (path == 0) {" NL "    g_buffer12[0].data += g_buffer12[1].inc;" NL
			   "  } else if (path == 1) {" NL "    g_buffer12[1].data += g_buffer12[0].inc;" NL "  }" NL "}" NL NL
			   "void Modify2(int path) {" NL "  if (path == 0) {" NL
			   "    atomicAdd(g_buffer4.data0, g_buffer4.inc0);" NL "    atomicAdd(g_buffer4.data1, g_buffer4.inc0);" NL
			   "  } else if (path == 1) {" NL "    atomicAdd(g_buffer4.data0, - g_buffer4.inc0);" NL
			   "    atomicAdd(g_buffer4.data1, - g_buffer4.inc0);" NL "  } else if (path == 2) {" NL
			   "    atomicAdd(g_buffer4.data0, g_buffer4.inc1);" NL "    atomicAdd(g_buffer4.data1, g_buffer4.inc1);" NL
			   "  }" NL "  if (path == 0) {" NL "    g_buffer56[0].data += g_buffer56[1].inc;" NL
			   "  } else if (path == 1) {" NL "    g_buffer56[1].data += g_buffer56[0].inc;" NL "  }" NL "}" NL NL
			   "void main() {" NL "  Modify1(int(gl_WorkGroupID.z));" NL "  atomicAdd(g_buffer3.data, 1);" NL
			   "  Modify2(int(gl_WorkGroupID.z));" NL "}";

		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(7, m_storage_buffer);

		/* Buffer0 */
		{
			int data[4] = { 0, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer1 */
		{
			int data[2] = { 3, 1 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer2 */
		{
			int data[2] = { 2, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer3 */
		{
			int data[1] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer4 */
		{
			int data[4] = { 0, 1, 0, 2 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer5 */
		{
			int data[2] = { 3, 1 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 5, m_storage_buffer[5]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer6 */
		{
			int data[2] = { 2, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 6, m_storage_buffer[6]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glUseProgram(m_program);

		glDispatchCompute(1, 1, 3);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glDispatchCompute(1, 1, 3);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* Buffer0 */
		{
			const int ref_data[4] = { 4, 1, 4, 2 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer0] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer1 */
		{
			const int ref_data[2] = { 3, 5 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer1] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer2 */
		{
			const int ref_data[2] = { 2, 10 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer2] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer3 */
		{
			const int ref_data[1] = { 6 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 1; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer3] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer4 */
		{
			const int ref_data[4] = { 4, 1, 4, 2 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 4; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer4] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer5 */
		{
			const int ref_data[2] = { 3, 5 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[5]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer5] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* Buffer6 */
		{
			const int ref_data[2] = { 2, 10 };
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[6]);
			int* data = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 8, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer6] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		return NO_ERROR;
	}